

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
ChebTools::Schur_realeigenvalues
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,MatrixXd *T)

{
  long lVar1;
  CoeffReturnType pdVar2;
  int iVar3;
  int iVar4;
  long col;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = 0;
  do {
    col = (long)iVar4;
    lVar1 = (T->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
    if (lVar1 <= col) {
      return __return_storage_ptr__;
    }
    if (lVar1 + -1 == col) {
LAB_001077d0:
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)T,col,col)
      ;
      std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,pdVar2);
      iVar3 = iVar4;
    }
    else {
      iVar3 = iVar4 + 1;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)T,
                          (long)iVar3,col);
      if ((*pdVar2 == 0.0) && (!NAN(*pdVar2))) goto LAB_001077d0;
    }
    iVar4 = iVar3 + 1;
  } while( true );
}

Assistant:

std::vector<double> Schur_realeigenvalues(const Eigen::MatrixXd &T){
        std::vector<double> roots;
        for (int i = 0; i < T.cols(); ++i) {
            if (i == T.cols()-1 || T(i+1,i) == 0){
                // This is a real 1x1 block, if it were the second row in a 2x2 block it
                // would have been skipped in the next conditional
                roots.push_back(T(i, i));
            }
            else{
                // this is the upper left element of a 2x2 block,
                // keep moving, skip the next row too
                i += 1;
            }
        }
        return roots;
    }